

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall yy::parser::yy_reduce_print_(parser *this,int yyrule)

{
  char cVar1;
  short sVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  
  sVar2 = *(short *)(yyrline_ + (long)yyrule * 2);
  cVar1 = yyr2_[yyrule];
  poVar3 = std::operator<<(this->yycdebug_,"Reducing stack by rule ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,yyrule + -1);
  poVar3 = std::operator<<(poVar3," (line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)sVar2);
  std::operator<<(poVar3,"):\n");
  uVar4 = 0;
  uVar5 = 0;
  if ('\0' < cVar1) {
    uVar5 = (ulong)(uint)(int)cVar1;
  }
  while (uVar4 != uVar5) {
    if (this->yydebug_ == 0) {
      uVar4 = uVar4 + 1;
    }
    else {
      poVar3 = std::operator<<(this->yycdebug_,"   $");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)(uVar4 + 1));
      poVar3 = std::operator<<(poVar3," =");
      std::operator<<(poVar3,' ');
      yy_print_<yy::parser::by_state>
                (this,this->yycdebug_,
                 &(this->yystack_).seq_.
                  super__Vector_base<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish[(int)uVar4 - (int)cVar1].
                  super_basic_symbol<yy::parser::by_state>);
      std::operator<<(this->yycdebug_,'\n');
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

void
  parser::yy_reduce_print_ (int yyrule) const
  {
    int yylno = yyrline_[yyrule];
    int yynrhs = yyr2_[yyrule];
    // Print the symbols being reduced, and their result.
    *yycdebug_ << "Reducing stack by rule " << yyrule - 1
               << " (line " << yylno << "):\n";
    // The symbols being reduced.
    for (int yyi = 0; yyi < yynrhs; yyi++)
      YY_SYMBOL_PRINT ("   $" << yyi + 1 << " =",
                       yystack_[(yynrhs) - (yyi + 1)]);
  }